

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

void update_anims(float now)

{
  int i;
  Flair *fl;
  float fVar1;
  Token *in_stack_fffffffffffffff0;
  Flair *spr;
  
  for (fVar1 = 0.0; (int)fVar1 < 0x80; fVar1 = (float)((int)fVar1 + 1)) {
    update_token_anims(in_stack_fffffffffffffff0,fVar1);
  }
  for (fVar1 = 0.0; (int)fVar1 < 4; fVar1 = (float)((int)fVar1 + 1)) {
    update_token_anims(in_stack_fffffffffffffff0,fVar1);
  }
  update_sprite_anims((Sprite *)in_stack_fffffffffffffff0,fVar1);
  update_sprite_anims((Sprite *)in_stack_fffffffffffffff0,fVar1);
  for (spr = flairs; spr != (Flair *)0x0; spr = spr->next) {
    update_sprite_anims((Sprite *)spr,fVar1);
  }
  return;
}

Assistant:

static void update_anims(float now)
{
   Flair *fl;
   int i;

   for (i = 0; i < NUM_TOKENS; i++)
      update_token_anims(&tokens[i], now);

   for (i = 0; i < NUM_TYPES; i++)
      update_token_anims(&buttons[i], now);

   update_sprite_anims(&glow, now);
   update_sprite_anims(&glow_overlay, now);

   for (fl = flairs; fl != NULL; fl = fl->next)
      update_sprite_anims(&fl->sprite, now);
}